

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_DontReportMatchedWhenIgnoring_Test::TestBody
          (MatchingTest_DontReportMatchedWhenIgnoring_Test *this)

{
  FieldDescriptor *field;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  Metadata MVar1;
  string_view name;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string output;
  TestField msg2;
  TestField msg1;
  MessageDifferencer differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2d8;
  Message local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  AssertHelper local_2c0;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  string local_298;
  undefined1 local_278 [88];
  undefined1 local_220 [88];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestField::TestField((TestField *)local_220,(Arena *)0x0);
  proto2_unittest::TestField::TestField((TestField *)local_278,(Arena *)0x0);
  local_220._72_4_ = 0x48;
  local_220[0x10] = local_220[0x10] | 2;
  local_278._72_4_ = 0x48;
  local_278[0x10] = local_278[0x10] | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_220 + 0x18),0xd);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_278 + 0x18),0xd);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_220 + 0x18),0x11);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_278 + 0x18),0x11);
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  local_1c8.report_matches_ = true;
  util::MessageDifferencer::ReportDifferencesToString(&local_1c8,&local_298);
  MVar1 = proto2_unittest::TestField::GetMetadata
                    ((TestField *)proto2_unittest::_TestField_default_instance_);
  name._M_str = "c";
  name._M_len = 1;
  field = Descriptor::FindFieldByName(MVar1.descriptor,name);
  util::MessageDifferencer::IgnoreField(&local_1c8,field);
  local_2d0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       util::MessageDifferencer::Compare(&local_1c8,(Message *)local_220,(Message *)local_278);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2d0.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b8,(internal *)&local_2d0,(AssertionResult *)0x126d6fd,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xfbb,(char *)CONCAT71(local_2b8._1_7_,local_2b8[0]));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2b8._1_7_,local_2b8[0]) != &local_2a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2b8._1_7_,local_2b8[0]),local_2a8._M_allocated_capacity + 1)
      ;
    }
    if (local_2d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2d8._M_head_impl + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  testing::internal::CmpHelperEQ<char[52],std::__cxx11::string>
            ((internal *)local_2b8,
             "\"ignored: c\\n\" \"matched: rc[0] : 13\\n\" \"matched: rc[1] : 17\\n\"","output",
             (char (*) [52])"ignored: c\nmatched: rc[0] : 13\nmatched: rc[1] : 17\n",&local_298);
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message(&local_2d0);
    if (local_2b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_2b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xfc0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2d8);
    if ((long *)CONCAT71(local_2d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_2d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_2d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2b0,local_2b0);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestField::~TestField((TestField *)local_278);
  proto2_unittest::TestField::~TestField((TestField *)local_220);
  return;
}

Assistant:

TEST_F(MatchingTest, DontReportMatchedWhenIgnoring) {
  proto2_unittest::TestField msg1, msg2;
  msg1.set_c(72);
  msg2.set_c(72);
  msg1.add_rc(13);
  msg2.add_rc(13);
  msg1.add_rc(17);
  msg2.add_rc(17);
  std::string output;
  MessageDifferencer differencer;
  differencer.set_report_matches(true);
  differencer.ReportDifferencesToString(&output);

  differencer.IgnoreField(msg1.GetDescriptor()->FindFieldByName("c"));

  EXPECT_TRUE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "ignored: c\n"
      "matched: rc[0] : 13\n"
      "matched: rc[1] : 17\n",
      output);
}